

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testConstructors<Imath_3_2::Vec2<long>>(char *type)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  ulong *puVar7;
  char *in_RDI;
  Box<Imath_3_2::Vec2<long>_> b_2;
  uint i_1;
  Vec2<long> p1;
  Vec2<long> p0;
  Box<Imath_3_2::Vec2<long>_> b_1;
  uint i;
  Vec2<long> p;
  Box<Imath_3_2::Vec2<long>_> b;
  Vec2<long> *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  bool bVar8;
  Vec2<long> *in_stack_fffffffffffffef8;
  Box<Imath_3_2::Vec2<long>_> *in_stack_ffffffffffffff00;
  bool local_f1;
  bool local_c9;
  Vec2<long> local_c8;
  Vec2<long> VStack_b8;
  uint local_a4;
  Vec2<long> local_a0;
  Vec2<long> local_90;
  Vec2<long> local_80;
  Vec2<long> VStack_70;
  uint local_5c;
  Vec2<long> local_58;
  Vec2<long> local_48;
  Vec2<long> local_38;
  Vec2<long> local_28;
  Vec2<long> VStack_18;
  char *local_8;
  
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"    constructors for type ");
  poVar4 = std::operator<<(poVar4,local_8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Box<Imath_3_2::Vec2<long>_>::Box
            ((Box<Imath_3_2::Vec2<long>_> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  lVar5 = Imath_3_2::Vec2<long>::baseTypeMax();
  Imath_3_2::Vec2<long>::Vec2(&local_38,lVar5);
  bVar1 = Imath_3_2::Vec2<long>::operator==(&local_28,&local_38);
  local_c9 = false;
  if (bVar1) {
    lVar5 = Imath_3_2::Vec2<long>::baseTypeLowest();
    Imath_3_2::Vec2<long>::Vec2(&local_48,lVar5);
    local_c9 = Imath_3_2::Vec2<long>::operator==(&VStack_18,&local_48);
  }
  if (local_c9 == false) {
    __assert_fail("b.min == T (T::baseTypeMax ()) && b.max == T (T::baseTypeLowest ())",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x58,
                  "void (anonymous namespace)::testConstructors(const char *) [T = Imath_3_2::Vec2<long>]"
                 );
  }
  Imath_3_2::Vec2<long>::Vec2(&local_58);
  for (local_5c = 0; uVar3 = local_5c, uVar2 = Imath_3_2::Vec2<long>::dimensions(), uVar3 < uVar2;
      local_5c = local_5c + 1) {
    uVar6 = (ulong)local_5c;
    puVar7 = (ulong *)Imath_3_2::Vec2<long>::operator[](&local_58,local_5c);
    *puVar7 = uVar6;
  }
  Imath_3_2::Box<Imath_3_2::Vec2<long>_>::Box
            ((Box<Imath_3_2::Vec2<long>_> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8
            );
  bVar1 = Imath_3_2::Vec2<long>::operator==(&local_80,&local_58);
  local_f1 = false;
  if (bVar1) {
    local_f1 = Imath_3_2::Vec2<long>::operator==(&VStack_70,&local_58);
  }
  if (local_f1 != false) {
    Imath_3_2::Vec2<long>::Vec2(&local_90);
    Imath_3_2::Vec2<long>::Vec2(&local_a0);
    for (local_a4 = 0; uVar3 = local_a4, uVar2 = Imath_3_2::Vec2<long>::dimensions(), uVar3 < uVar2;
        local_a4 = local_a4 + 1) {
      in_stack_fffffffffffffef8 = (Vec2<long> *)(ulong)local_a4;
      puVar7 = (ulong *)Imath_3_2::Vec2<long>::operator[](&local_90,local_a4);
      *puVar7 = (ulong)in_stack_fffffffffffffef8;
      uVar3 = Imath_3_2::Vec2<long>::dimensions();
      in_stack_ffffffffffffff00 =
           (Box<Imath_3_2::Vec2<long>_> *)(ulong)((uVar3 * 10 - local_a4) - 1);
      puVar7 = (ulong *)Imath_3_2::Vec2<long>::operator[](&local_a0,local_a4);
      *puVar7 = (ulong)in_stack_ffffffffffffff00;
    }
    Imath_3_2::Box<Imath_3_2::Vec2<long>_>::Box
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (Vec2<long> *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    bVar1 = Imath_3_2::Vec2<long>::operator==(&local_c8,&local_90);
    bVar8 = false;
    if (bVar1) {
      bVar8 = Imath_3_2::Vec2<long>::operator==(&VStack_b8,&local_a0);
    }
    if (bVar8 != false) {
      return;
    }
    __assert_fail("b.min == p0 && b.max == p1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x74,
                  "void (anonymous namespace)::testConstructors(const char *) [T = Imath_3_2::Vec2<long>]"
                 );
  }
  __assert_fail("b.min == p && b.max == p",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                ,100,
                "void (anonymous namespace)::testConstructors(const char *) [T = Imath_3_2::Vec2<long>]"
               );
}

Assistant:

static void
testConstructors (const char* type)
{
    cout << "    constructors for type " << type << endl;

    //
    // Empty
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert (
            b.min == T (T::baseTypeMax ()) &&
            b.max == T (T::baseTypeLowest ()));
    }

    //
    // Single point
    //
    {
        T p;
        for (unsigned int i = 0; i < T::dimensions (); i++)
            p[i] = static_cast<typename T::BaseType>(i);

        IMATH_INTERNAL_NAMESPACE::Box<T> b (p);
        assert (b.min == p && b.max == p);
    }

    //
    // Min and max
    //
    {
        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions (); i++)
        {
            p0[i] = static_cast<typename T::BaseType>(i);
            p1[i] = static_cast<typename T::BaseType>(10 * T::dimensions () - i - 1);
        }

        IMATH_INTERNAL_NAMESPACE::Box<T> b (p0, p1);
        assert (b.min == p0 && b.max == p1);
    }
}